

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *method,Reader *replacement)

{
  uint64_t uVar1;
  uint64_t uVar2;
  Fault local_a0;
  Fault f_1;
  Fault local_90;
  Fault f;
  undefined1 local_78 [8];
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_schema_loader_c__:916:5)>
  _kjContext916;
  anon_class_8_1_60e9c21f _kjContextFunc916;
  Reader *replacement_local;
  Reader *method_local;
  CompatibilityChecker *this_local;
  
  _kjContext916.func = (anon_class_8_1_60e9c21f *)method;
  kj::_::Debug::
  ContextImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++:916:5)>
  ::ContextImpl((ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_schema_loader_c__:916:5)>
                 *)local_78,(anon_class_8_1_60e9c21f *)&_kjContext916.func);
  uVar1 = capnp::schema::Method::Reader::getParamStructType(method);
  uVar2 = capnp::schema::Method::Reader::getParamStructType(replacement);
  if (uVar1 == uVar2) {
    uVar1 = capnp::schema::Method::Reader::getResultStructType(method);
    uVar2 = capnp::schema::Method::Reader::getResultStructType(replacement);
    if (uVar1 == uVar2) {
      f_1.exception._4_4_ = 0;
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38]>
                (&local_a0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x39a,FAILED,"method.getResultStructType() == replacement.getResultStructType()",
                 "\"Updated method has different results.\"",
                 (char (*) [38])"Updated method has different results.");
      this->compatibility = INCOMPATIBLE;
      f_1.exception._4_4_ = 1;
      kj::_::Debug::Fault::~Fault(&local_a0);
    }
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[41]>
              (&local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x398,FAILED,"method.getParamStructType() == replacement.getParamStructType()",
               "\"Updated method has different parameters.\"",
               (char (*) [41])"Updated method has different parameters.");
    this->compatibility = INCOMPATIBLE;
    f_1.exception._4_4_ = 1;
    kj::_::Debug::Fault::~Fault(&local_90);
  }
  kj::_::Debug::
  ContextImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++:916:5)>
  ::~ContextImpl((ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_schema_loader_c__:916:5)>
                  *)local_78);
  return;
}

Assistant:

void checkCompatibility(const schema::Method::Reader& method,
                          const schema::Method::Reader& replacement) {
    KJ_CONTEXT("comparing method", method.getName());

    // TODO(someday):  Allow named parameter list to be replaced by compatible struct type.
    VALIDATE_SCHEMA(method.getParamStructType() == replacement.getParamStructType(),
                    "Updated method has different parameters.");
    VALIDATE_SCHEMA(method.getResultStructType() == replacement.getResultStructType(),
                    "Updated method has different results.");
  }